

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.h
# Opt level: O2

void __thiscall Coin::Clear(Coin *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CTxOut::SetNull(&this->out);
  *(undefined4 *)&this->field_0x28 = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Clear() {
        out.SetNull();
        fCoinBase = false;
        nHeight = 0;
    }